

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O0

void __thiscall
Fade::mergeCategoricalValues
          (Fade *this,vector<double,_std::allocator<double>_> *out,int *outOffsets,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *in,vector<int_*,_std::allocator<int_*>_> *inOffsets)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<int_*,_std::allocator<int_*>_> *pvVar2;
  int *this_00;
  int iVar3;
  element_type *peVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference ppiVar8;
  long lVar9;
  int *__s;
  double dVar10;
  int aiStack_e8 [4];
  Fade *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int local_b4;
  int local_b0;
  int j_1;
  int k_5;
  int k_4;
  int l_1;
  int k_3;
  int x;
  int k_2;
  value_type *a;
  int j;
  bool isMinVal;
  double agg;
  int local_78;
  int iStack_74;
  bool newValue;
  int l;
  int k_1;
  int part;
  int k;
  int degreeOfAggGroup;
  int aggGroup;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_40;
  int local_3c;
  int numOfPartitions;
  int firstCatAggOffset;
  int numOfAggGroups;
  int rootID;
  vector<int_*,_std::allocator<int_*>_> *inOffsets_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_local;
  int *outOffsets_local;
  vector<double,_std::allocator<double>_> *out_local;
  Fade *this_local;
  
  local_d8 = this;
  _numOfAggGroups = inOffsets;
  inOffsets_local = (vector<int_*,_std::allocator<int_*>_> *)in;
  in_local = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)outOffsets;
  outOffsets_local = (int *)out;
  out_local = (vector<double,_std::allocator<double>_> *)this;
  peVar4 = std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1a22e3);
  firstCatAggOffset = peVar4->_root->_id;
  numOfPartitions =
       local_d8->_numberOfAggregatesPerNode
       [(long)firstCatAggOffset + dfdb::params::NUM_OF_ATTRIBUTES * 2];
  local_3c = local_d8->_numberOfAggregatesPerNode
             [dfdb::params::NUM_OF_ATTRIBUTES * 3 + (long)firstCatAggOffset];
  sVar5 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)inOffsets_local);
  local_40 = (int)sVar5;
  __vla_expr1 = dfdb::params::DEGREE_OF_INTERACTIONS * 2;
  local_d0 = aiStack_e8 + dfdb::params::DEGREE_OF_INTERACTIONS * -4;
  __vla_expr2 = dfdb::params::DEGREE_OF_INTERACTIONS * 2;
  local_c8 = local_d0 + dfdb::params::DEGREE_OF_INTERACTIONS * -4;
  _degreeOfAggGroup = sVar5 & 0xffffffff;
  __s = (int *)((long)local_c8 - (_degreeOfAggGroup * 4 + 0xf & 0xfffffffffffffff0));
  lVar9 = (long)local_40;
  local_c0 = __s;
  __vla_expr0 = (unsigned_long)aiStack_e8;
  __s[-2] = 0x1a23b8;
  __s[-1] = 0;
  memset(__s,0,lVar9 << 2);
  k = 0;
  do {
    if (numOfPartitions <= k) {
      return;
    }
    part = local_d8->_degreeOfCategoricalAggregateGroup[local_3c + k];
    for (k_1 = 0; pvVar2 = inOffsets_local, k_1 < part; k_1 = k_1 + 1) {
      __s[-2] = 0x1a2404;
      __s[-1] = 0;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)pvVar2,0);
      iVar3 = *local_c0 + k_1;
      __s[-2] = 0x1a241b;
      __s[-1] = 0;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)iVar3);
      *(value_type *)(local_d0 + (long)k_1 * 2) = *pvVar7;
      __s[-2] = 0x1a2437;
      __s[-1] = 0;
      dVar10 = std::numeric_limits<double>::max();
      *(double *)(local_c8 + (long)k_1 * 2) = dVar10;
    }
    for (l = 1; l < local_40; l = l + 1) {
      for (iStack_74 = 0; pvVar2 = inOffsets_local, iStack_74 < part; iStack_74 = iStack_74 + 1) {
        sVar5 = (size_type)l;
        __s[-2] = 0x1a2485;
        __s[-1] = 0;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)pvVar2,sVar5);
        iVar3 = local_c0[l] + iStack_74;
        __s[-2] = 0x1a24a1;
        __s[-1] = 0;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)iVar3);
        if (*pvVar7 < *(double *)(local_d0 + (long)iStack_74 * 2)) {
          for (local_78 = iStack_74; pvVar2 = inOffsets_local, local_78 < part;
              local_78 = local_78 + 1) {
            sVar5 = (size_type)l;
            __s[-2] = 0x1a24d9;
            __s[-1] = 0;
            pvVar6 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)pvVar2,sVar5);
            iVar3 = local_c0[l] + local_78;
            __s[-2] = 0x1a24f5;
            __s[-1] = 0;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)iVar3);
            *(value_type *)(local_d0 + (long)local_78 * 2) = *pvVar7;
          }
        }
        pvVar2 = inOffsets_local;
        sVar5 = (size_type)l;
        __s[-2] = 0x1a2526;
        __s[-1] = 0;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)pvVar2,sVar5);
        iVar3 = local_c0[l] + iStack_74;
        __s[-2] = 0x1a2542;
        __s[-1] = 0;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)iVar3);
        if (*(double *)(local_d0 + (long)iStack_74 * 2) <= *pvVar7 &&
            *pvVar7 != *(double *)(local_d0 + (long)iStack_74 * 2)) break;
      }
    }
    agg._7_1_ = 1;
    while (this_00 = outOffsets_local, (agg._7_1_ & 1) != 0) {
      _j = 0.0;
      agg._7_1_ = 0;
      for (a._0_4_ = 0; pvVar2 = _numOfAggGroups, (int)a < local_40; a._0_4_ = (int)a + 1) {
        aiStack_e8[3] = local_c0[(int)a];
        sVar5 = (size_type)(int)a;
        __s[-2] = 0x1a25d7;
        __s[-1] = 0;
        ppiVar8 = std::vector<int_*,_std::allocator<int_*>_>::operator[](pvVar2,sVar5);
        pvVar2 = inOffsets_local;
        if (aiStack_e8[3] < (*ppiVar8)[k]) {
          sVar5 = (size_type)(int)a;
          __s[-2] = 0x1a2600;
          __s[-1] = 0;
          _x = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)pvVar2,sVar5);
          a._7_1_ = 1;
          for (k_3 = 0; pvVar1 = _x, k_3 < part; k_3 = k_3 + 1) {
            l_1 = local_c0[(int)a] + k_3;
            sVar5 = (size_type)l_1;
            __s[-2] = 0x1a2653;
            __s[-1] = 0;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,sVar5);
            if ((*pvVar7 != *(double *)(local_d0 + (long)k_3 * 2)) ||
               (NAN(*pvVar7) || NAN(*(double *)(local_d0 + (long)k_3 * 2)))) {
              a._7_1_ = 0;
              break;
            }
          }
          pvVar1 = _x;
          if ((a._7_1_ & 1) != 0) {
            iVar3 = local_c0[(int)a] + part;
            __s[-2] = 0x1a26bb;
            __s[-1] = 0;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)iVar3);
            _j = *pvVar7 + _j;
            local_c0[(int)a] = part + 1 + local_c0[(int)a];
          }
          pvVar2 = _numOfAggGroups;
          a._7_1_ = 0;
          aiStack_e8[2] = local_c0[(int)a];
          sVar5 = (size_type)(int)a;
          __s[-2] = 0x1a2714;
          __s[-1] = 0;
          ppiVar8 = std::vector<int_*,_std::allocator<int_*>_>::operator[](pvVar2,sVar5);
          if (aiStack_e8[2] < (*ppiVar8)[k]) {
            a._7_1_ = 1;
            for (k_4 = 0; pvVar1 = _x, k_4 < part; k_4 = k_4 + 1) {
              iVar3 = local_c0[(int)a] + k_4;
              __s[-2] = 0x1a2773;
              __s[-1] = 0;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)iVar3);
              if (*pvVar7 < *(double *)(local_c8 + (long)k_4 * 2)) {
                for (k_5 = k_4; pvVar1 = _x, k_5 < part; k_5 = k_5 + 1) {
                  iVar3 = local_c0[(int)a] + k_5;
                  __s[-2] = 0x1a27d0;
                  __s[-1] = 0;
                  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (pvVar1,(long)iVar3);
                  *(value_type *)(local_c8 + (long)k_5 * 2) = *pvVar7;
                }
              }
              pvVar1 = _x;
              iVar3 = local_c0[(int)a] + k_4;
              __s[-2] = 0x1a2823;
              __s[-1] = 0;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,(long)iVar3);
              if (*(double *)(local_c8 + (long)k_4 * 2) <= *pvVar7 &&
                  *pvVar7 != *(double *)(local_c8 + (long)k_4 * 2)) {
                a._7_1_ = 0;
                break;
              }
            }
          }
          if ((a._7_1_ & 1) != 0) {
            agg._7_1_ = 1;
          }
        }
      }
      for (j_1 = 0; j_1 < part; j_1 = j_1 + 1) {
        __s[-2] = 0x1a28b8;
        __s[-1] = 0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (*(vector<double,_std::allocator<double>_> **)(__s + 6),
                   *(value_type_conflict3 **)(__s + 4));
      }
      __s[-2] = 0x1a28d6;
      __s[-1] = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                (*(vector<double,_std::allocator<double>_> **)(__s + 6),
                 *(value_type_conflict3 **)(__s + 4));
      for (local_b0 = 0; local_b0 < part; local_b0 = local_b0 + 1) {
        *(undefined8 *)(local_d0 + (long)local_b0 * 2) =
             *(undefined8 *)(local_c8 + (long)local_b0 * 2);
        __s[-2] = 0x1a2916;
        __s[-1] = 0;
        dVar10 = std::numeric_limits<double>::max();
        *(double *)(local_c8 + (long)local_b0 * 2) = dVar10;
      }
    }
    for (local_b4 = 0; local_b4 < local_40; local_b4 = local_b4 + 1) {
    }
    __s[-2] = 0x1a2970;
    __s[-1] = 0;
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)this_00);
    *(int *)((long)&(in_local->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + (long)k * 4) = (int)sVar5;
    k = k + 1;
  } while( true );
}

Assistant:

void Fade::mergeCategoricalValues(vector<double>& out, int* outOffsets,
	std::vector<std::vector<double> > const &in, std::vector<int*> const &inOffsets)
{
	int rootID = _dTree->_root->_id;
	int numOfAggGroups = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];
	int firstCatAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID];

	int numOfPartitions = in.size();
        
	double minVal[DEGREE_OF_INTERACTIONS * 2];
	double nextMinVal[DEGREE_OF_INTERACTIONS * 2];

	int pointer[numOfPartitions];
	memset(&pointer[0], 0, sizeof(int) * numOfPartitions);

	for (int aggGroup = 0; aggGroup < numOfAggGroups; ++aggGroup)
	{
		int degreeOfAggGroup = _degreeOfCategoricalAggregateGroup[firstCatAggOffset + aggGroup];

		/* initialize minVal and nextMinVal */
		for (int k = 0; k < degreeOfAggGroup; ++k)
		{
			minVal[k] = in[0][pointer[0] + k];
			nextMinVal[k] = std::numeric_limits<double>::max();
		}

		/* find the minimum value array */
		for (int part = 1; part < numOfPartitions; ++part)
		{
			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				if (in[part][pointer[part] + k] < minVal[k])
				{
					for (int l = k; l < degreeOfAggGroup; ++l)
						minVal[l] = in[part][pointer[part] + l];
				}
				if (in[part][pointer[part] + k] > minVal[k])
					break;
			}
		}

		bool newValue = true;
		while (newValue)
		{
			double agg = 0.0;
			newValue = false;

			bool isMinVal;

			for (int j = 0; j < numOfPartitions; ++j)
			{
				if (pointer[j] < inOffsets[j][aggGroup])
				{
					auto& a = in[j];

				 	isMinVal = true;

					for (int k = 0; k < degreeOfAggGroup; ++k)
					{
                        int x = pointer[j] + k;

						if (a[x] != minVal[k])
						{
							isMinVal = false;
							break;
						}
					}

					if (isMinVal)
					{
						// printf("isMinVal %d  pointer[j] %d  inOff[j][i] %d \n", isMinVal, pointer[j], inOffsets[j][aggGroup]);
					  	agg += a[pointer[j] + degreeOfAggGroup];
						pointer[j] += degreeOfAggGroup + 1;
					}

					isMinVal = false;

					// printf("id: %d d: %d pointer[j]: %d  childAggCounts[d][j][i]: %d \n", nodeID, d, pointer[j], childAggCounts[d][j][i]);
					if (pointer[j] < inOffsets[j][aggGroup])
					{
						isMinVal = true;

						for (int k = 0; k < degreeOfAggGroup; ++k)
						{
							if (a[pointer[j] + k] < nextMinVal[k])
							{
								for (int l = k; l < degreeOfAggGroup; ++l)
								{
									nextMinVal[l] = a[pointer[j] + l];
								}
							}
							if (a[pointer[j] + k] > nextMinVal[k])
							{
								isMinVal = false;
								break;
							}
                            // printf("nextMinVal: %f \n", nextMinVal[k]);
						}
					}
					// printf("isMinVal %d   Degree:  %lu   nodeID: %d \n", isMinVal, d, nodeID);

					if (isMinVal) newValue = true;
				}
			}

            // printf("nextMinVal: ");
            // for (int k = 0; k < degreeOfAggGroup; ++k)
            //     printf("%.2f ", nextMinVal[k]);
            // printf("\n");

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				// printf("minVal entered:  %f \n", minVal[k]);
				out.push_back(minVal[k]);
			}

			//printf("agg entered:  %f \n", agg);
			out.push_back(agg);

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				minVal[k] = nextMinVal[k];
				nextMinVal[k] =  std::numeric_limits<double>::max();
			}
		}

		for (int j = 0; j < numOfPartitions; ++j)
			assert(pointer[j] == inOffsets[j][aggGroup]);

		outOffsets[aggGroup] = out.size();
	}

	// printf("outAggregates:  ");	int off = 0;
	// for (size_t i = 0; i < out.size(); ++i) {
	// 	if (i == (size_t) outOffsets[off]) {
	// 		printf(" | "); ++off; }
	// 	printf("%.2f ", out[i]);
	// } printf("\n");
	// printf("outOffsets:  ");
	// for (int i = 0; i < numOfAggGroups; ++i)
	// 	printf("%d ", outOffsets[i]);
	// printf("\n");
}